

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

int run_test_fs_readlink(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_fs_t req;
  uv_fs_t local_1c0;
  
  loop = uv_default_loop();
  iVar1 = uv_fs_readlink(loop,&local_1c0,"no_such_file",dummy_cb);
  if (iVar1 == 0) {
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0015c230;
    if (dummy_cb_count != 1) goto LAB_0015c235;
    if (local_1c0.ptr != (void *)0x0) goto LAB_0015c23a;
    if (local_1c0.result != -2) goto LAB_0015c23f;
    uv_fs_req_cleanup(&local_1c0);
    iVar1 = uv_fs_readlink((uv_loop_t *)0x0,&local_1c0,"no_such_file",(uv_fs_cb)0x0);
    if (iVar1 != -2) goto LAB_0015c244;
    if (local_1c0.ptr != (void *)0x0) goto LAB_0015c249;
    if (local_1c0.result == -2) {
      uv_fs_req_cleanup(&local_1c0);
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0015c253;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_0015c230:
    run_test_fs_readlink_cold_2();
LAB_0015c235:
    run_test_fs_readlink_cold_3();
LAB_0015c23a:
    run_test_fs_readlink_cold_4();
LAB_0015c23f:
    run_test_fs_readlink_cold_5();
LAB_0015c244:
    run_test_fs_readlink_cold_6();
LAB_0015c249:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_0015c253:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_readlink) {
  uv_fs_t req;

  loop = uv_default_loop();
  ASSERT(0 == uv_fs_readlink(loop, &req, "no_such_file", dummy_cb));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(dummy_cb_count == 1);
  ASSERT_NULL(req.ptr);
  ASSERT(req.result == UV_ENOENT);
  uv_fs_req_cleanup(&req);

  ASSERT(UV_ENOENT == uv_fs_readlink(NULL, &req, "no_such_file", NULL));
  ASSERT_NULL(req.ptr);
  ASSERT(req.result == UV_ENOENT);
  uv_fs_req_cleanup(&req);

  MAKE_VALGRIND_HAPPY();
  return 0;
}